

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecking.cc
# Opt level: O2

shared_ptr<tchecker::typed_statement_t> __thiscall
tchecker::details::statement_typechecker_t::acquire_typed_statement(statement_typechecker_t *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<tchecker::typed_statement_t> sVar1;
  __shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::__shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 8));
  local_28._M_ptr = (element_type *)0x0;
  local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 8),
             &local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  sVar1.super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<tchecker::typed_statement_t>)
         sVar1.super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<tchecker::typed_statement_t> acquire_typed_statement()
  {
    auto acquired_typed_stmt = _typed_stmt;
    _typed_stmt = nullptr;
    return acquired_typed_stmt;
  }